

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

void add_date(http_s *r)

{
  int *piVar1;
  fio_lock_i fVar2;
  FIOBJ FVar3;
  char *target;
  char cVar4;
  FIOBJ FVar5;
  fiobj_object_vtable_s *pfVar6;
  size_t size;
  FIOBJ FVar7;
  uint uVar8;
  uint uVar9;
  timespec tVar10;
  fio_lock_i ret_2;
  fio_str_info_s ret;
  timespec local_48;
  fio_str_info_s local_38;
  
  if (add_date::date_hash == 0) {
    add_date::date_hash = fio_siphash13("date",4,0x144e87,0x1453b6);
  }
  if (add_date::mod_hash == 0) {
    add_date::mod_hash = fio_siphash13("last-modified",0xd,0x144e87,0x1453b6);
  }
  tVar10 = fio_last_tick();
  if (tVar10.tv_sec <= last_date_added) goto LAB_00147572;
  LOCK();
  UNLOCK();
  local_48.tv_sec = CONCAT71(local_48.tv_sec._1_7_,date_lock);
  while (date_lock != '\0') {
    date_lock = '\x01';
    local_48.tv_sec = 0;
    local_48.tv_nsec = 1;
    nanosleep(&local_48,(timespec *)0x0);
    LOCK();
    UNLOCK();
    local_48.tv_sec = CONCAT71(local_48.tv_sec._1_7_,date_lock);
  }
  date_lock = '\x01';
  tVar10 = fio_last_tick();
  if (last_date_added < tVar10.tv_sec) {
    FVar5 = fiobj_str_buf(0x20);
    FVar3 = current_date;
    if (FVar5 == 0) {
LAB_00147476:
      local_38.data = anon_var_dwarf_20f;
      local_38.len._0_4_ = 4;
      goto LAB_00147489;
    }
    if ((FVar5 & 1) == 0) {
      uVar8 = (uint)FVar5 & 6;
      cVar4 = '(';
      switch(uVar8) {
      case 0:
switchD_0014743d_caseD_0:
        cVar4 = *(char *)(FVar5 & 0xfffffffffffffff8);
        break;
      case 4:
switchD_0014743d_caseD_4:
        cVar4 = '*';
        break;
      case 6:
        if ((char)FVar5 == '&') {
          local_38.data = anon_var_dwarf_21a;
          local_38.len._0_4_ = 5;
        }
        else {
          uVar9 = (uint)FVar5 & 0xff;
          if (uVar9 != 0x16) {
            if (uVar9 == 6) goto LAB_00147476;
            switch(uVar8) {
            case 0:
              goto switchD_0014743d_caseD_0;
            case 4:
              goto switchD_0014743d_caseD_4;
            case 6:
              cVar4 = (char)FVar5;
            }
            break;
          }
          local_38.data = anon_var_dwarf_225;
          local_38.len._0_4_ = 4;
        }
LAB_00147489:
        local_38.capa._0_4_ = 0;
        local_38.capa._4_4_ = 0;
        local_38.len._4_4_ = 0;
        goto LAB_00147529;
      }
      switch(cVar4) {
      case '\'':
        pfVar6 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        pfVar6 = &FIOBJECT_VTABLE_STRING;
        break;
      case ')':
        pfVar6 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        pfVar6 = &FIOBJECT_VTABLE_HASH;
        break;
      case '+':
        pfVar6 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar6 = &FIOBJECT_VTABLE_NUMBER;
      }
      (*pfVar6->to_str)(&local_38,FVar5);
    }
    else {
      fio_ltocstr(&local_38,(long)FVar5 >> 1);
    }
LAB_00147529:
    target = local_38.data;
    tVar10 = fio_last_tick();
    size = http_time2str(target,tVar10.tv_sec);
    fiobj_str_resize(FVar5,size);
    tVar10 = fio_last_tick();
    last_date_added = tVar10.tv_sec;
    current_date = FVar5;
    fiobj_free(FVar3);
  }
  fVar2 = date_lock;
  LOCK();
  date_lock = '\0';
  UNLOCK();
  local_48.tv_sec = CONCAT71(local_48.tv_sec._1_7_,fVar2);
LAB_00147572:
  FVar7 = fiobj_hash_get2((r->private_data).out_headers,add_date::date_hash);
  FVar5 = HTTP_HEADER_DATE;
  FVar3 = current_date;
  if (FVar7 == 0) {
    FVar7 = (r->private_data).out_headers;
    if ((((~(uint)current_date & 6) != 0) && (current_date != 0)) && ((current_date & 1) == 0)) {
      LOCK();
      piVar1 = (int *)((current_date & 0xfffffffffffffff8) + 4);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    fiobj_hash_set(FVar7,FVar5,FVar3);
  }
  if ((r->status_str == 0) &&
     (FVar7 = fiobj_hash_get2((r->private_data).out_headers,add_date::mod_hash),
     FVar5 = HTTP_HEADER_LAST_MODIFIED, FVar3 = current_date, FVar7 == 0)) {
    FVar7 = (r->private_data).out_headers;
    if (((~(uint)current_date & 6) != 0) && ((current_date != 0 && ((current_date & 1) == 0)))) {
      LOCK();
      piVar1 = (int *)((current_date & 0xfffffffffffffff8) + 4);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    fiobj_hash_set(FVar7,FVar5,FVar3);
  }
  return;
}

Assistant:

static inline void add_date(http_s *r) {
  static uint64_t date_hash = 0;
  if (!date_hash)
    date_hash = fiobj_hash_string("date", 4);
  static uint64_t mod_hash = 0;
  if (!mod_hash)
    mod_hash = fiobj_hash_string("last-modified", 13);

  if (fio_last_tick().tv_sec > last_date_added) {
    fio_lock(&date_lock);
    if (fio_last_tick().tv_sec > last_date_added) { /* retest inside lock */
      FIOBJ tmp = fiobj_str_buf(32);
      FIOBJ old = current_date;
      fiobj_str_resize(
          tmp, http_time2str(fiobj_obj2cstr(tmp).data, fio_last_tick().tv_sec));
      last_date_added = fio_last_tick().tv_sec;
      current_date = tmp;
      fiobj_free(old);
    }
    fio_unlock(&date_lock);
  }

  if (!fiobj_hash_get2(r->private_data.out_headers, date_hash)) {
    fiobj_hash_set(r->private_data.out_headers, HTTP_HEADER_DATE,
                   fiobj_dup(current_date));
  }
  if (r->status_str == FIOBJ_INVALID &&
      !fiobj_hash_get2(r->private_data.out_headers, mod_hash)) {
    fiobj_hash_set(r->private_data.out_headers, HTTP_HEADER_LAST_MODIFIED,
                   fiobj_dup(current_date));
  }
}